

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::~ImplicitProducer(ImplicitProducer *this)

{
  Block *b;
  size_t sVar1;
  BlockIndexEntry *pBVar2;
  bool bVar3;
  bool local_a1;
  BlockIndexHeader *prev;
  size_t i;
  __pointer_type localBlockIndex;
  __pointer_type pBStack_58;
  bool forceFreeLastBlock;
  Block *block;
  __int_type_conflict index;
  __int_type_conflict tail;
  ImplicitProducer *this_local;
  memory_order __b_1;
  memory_order __b;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ImplicitProducer_00282848;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  b = (Block *)(this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  block = (Block *)(this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i;
  pBStack_58 = (Block *)0x0;
  local_a1 = true;
  if (block != b) {
    local_a1 = details::circular_less_than<unsigned_long>((unsigned_long)block,(unsigned_long)b);
  }
  if (local_a1 == false) {
    __assert_fail("index == tail || details::circular_less_than(index, tail)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                  ,0x937,
                  "virtual moodycamel::ConcurrentQueue<unsigned int>::ImplicitProducer::~ImplicitProducer() [T = unsigned int, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                 );
  }
  bVar3 = block != b;
  for (; block != b; block = (Block *)((long)&block->field_0 + 1)) {
    if ((((ulong)block & 0x1f) == 0) || (pBStack_58 == (Block *)0x0)) {
      if (pBStack_58 != (Block *)0x0) {
        add_block_to_free_list((this->super_ProducerBase).parent,pBStack_58);
      }
      pBVar2 = get_block_index_entry_for_index(this,(index_t)block);
      pBStack_58 = std::
                   atomic<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
                   ::load(&pBVar2->value,memory_order_relaxed);
    }
    Block::operator[](pBStack_58,(index_t)block);
  }
  if (((this->super_ProducerBase).tailBlock != (Block *)0x0) &&
     ((bVar3 || (((ulong)b & 0x1f) != 0)))) {
    add_block_to_free_list((this->super_ProducerBase).parent,(this->super_ProducerBase).tailBlock);
  }
  i = (size_t)std::
              atomic<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
              ::load(&this->blockIndex,memory_order_relaxed);
  if ((__pointer_type)i != (__pointer_type)0x0) {
    for (prev = (BlockIndexHeader *)0x0; prev != (BlockIndexHeader *)((__pointer_type)i)->capacity;
        prev = (BlockIndexHeader *)((long)&prev->capacity + 1)) {
    }
    do {
      sVar1 = *(size_t *)(i + 0x20);
      ConcurrentQueueDefaultTraits::free((void *)i);
      i = sVar1;
    } while (sVar1 != 0);
  }
  ProducerBase::~ProducerBase(&this->super_ProducerBase);
  return;
}

Assistant:

~ImplicitProducer()
		{
			// Note that since we're in the destructor we can assume that all enqueue/dequeue operations
			// completed already; this means that all undequeued elements are placed contiguously across
			// contiguous blocks, and that only the first and last remaining blocks can be only partially
			// empty (all other remaining blocks must be completely full).
			
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
			// Unregister ourselves for thread termination notification
			if (!this->inactive.load(std::memory_order_relaxed)) {
				details::ThreadExitNotifier::unsubscribe(&threadExitListener);
			}
#endif
			
			// Destroy all remaining elements!
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto index = this->headIndex.load(std::memory_order_relaxed);
			Block* block = nullptr;
			assert(index == tail || details::circular_less_than(index, tail));
			bool forceFreeLastBlock = index != tail;		// If we enter the loop, then the last (tail) block will not be freed
			while (index != tail) {
				if ((index & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 || block == nullptr) {
					if (block != nullptr) {
						// Free the old block
						this->parent->add_block_to_free_list(block);
					}
					
					block = get_block_index_entry_for_index(index)->value.load(std::memory_order_relaxed);
				}
				
				((*block)[index])->~T();
				++index;
			}
			// Even if the queue is empty, there's still one block that's not on the free list
			// (unless the head index reached the end of it, in which case the tail will be poised
			// to create a new block).
			if (this->tailBlock != nullptr && (forceFreeLastBlock || (tail & static_cast<index_t>(BLOCK_SIZE - 1)) != 0)) {
				this->parent->add_block_to_free_list(this->tailBlock);
			}
			
			// Destroy block index
			auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);
			if (localBlockIndex != nullptr) {
				for (size_t i = 0; i != localBlockIndex->capacity; ++i) {
					localBlockIndex->index[i]->~BlockIndexEntry();
				}
				do {
					auto prev = localBlockIndex->prev;
					localBlockIndex->~BlockIndexHeader();
					(Traits::free)(localBlockIndex);
					localBlockIndex = prev;
				} while (localBlockIndex != nullptr);
			}
		}